

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_accessor_2.cpp
# Opt level: O0

void __thiscall
UDPSplitAddrPacketReader::UDPSplitAddrPacketReader
          (UDPSplitAddrPacketReader *this,Socket *socket,int max,int mtu)

{
  int mtu_local;
  int max_local;
  Socket *socket_local;
  UDPSplitAddrPacketReader *this_local;
  
  Reader::Reader((Reader *)this);
  PacketReader::PacketReader((PacketReader *)this,&PTR_PTR_001252d8);
  UDPSplitPacketReader::UDPSplitPacketReader
            (&this->super_UDPSplitPacketReader,&PTR_PTR_001252b0,socket->sockfd,max,mtu);
  *(undefined ***)&this->super_UDPSplitPacketReader = &PTR_read_00125290;
  *(undefined ***)&this->super_UDPSplitPacketReader = &PTR_read_00125290;
  *(undefined ***)&this->super_UDPSplitPacketReader = &PTR_read_00125290;
  return;
}

Assistant:

UDPSplitAddrPacketReader::UDPSplitAddrPacketReader(Socket &socket, int max, int mtu) : UDPSplitPacketReader(socket.sockfd, max, mtu) {}